

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O0

QDebugIfHasDebugStreamContainer<QList<QVariant>,_QVariant>
operator<<(QDebug *debug,QList<QVariant> *vec)

{
  QList<QVariant> *in_RDX;
  char *in_RSI;
  Stream *in_RDI;
  long in_FS_OFFSET;
  QDebug *in_stack_ffffffffffffffb8;
  Stream *debug_00;
  QDebug local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  debug_00 = in_RDI;
  QDebug::QDebug((QDebug *)in_RDI,in_stack_ffffffffffffffb8);
  QtPrivate::printSequentialContainer<QList<QVariant>>((QDebug *)debug_00,in_RSI,in_RDX);
  QDebug::~QDebug(&local_10);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QDebugIfHasDebugStreamContainer<QList<QVariant>,_QVariant>)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

inline QDebugIfHasDebugStreamContainer<QList<T>, T> operator<<(QDebug debug, const QList<T> &vec)
{
    return QtPrivate::printSequentialContainer(std::move(debug), "QList", vec);
}